

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

wchar_t convert_vanilla_res_level(wchar_t i)

{
  wchar_t wVar1;
  
  if (L'\x7ffffffc' < i) {
    return L'\x80000003' - i;
  }
  if (i < L'\x03') {
    if (i < L'\x01') {
      return (uint)(i != L'\0') * 2;
    }
    wVar1 = L'\x01';
  }
  else {
    wVar1 = L'\x03';
  }
  return wVar1;
}

Assistant:

static int convert_vanilla_res_level(int i)
{
	int result;

	if (i == UI_ENTRY_UNKNOWN_VALUE) {
		result = 4;
	} else if (i == UI_ENTRY_VALUE_NOT_PRESENT) {
		result = 5;
	} else if (i == UI_ENTRY_RESIST0_RES_VUL) {
		result = 6;
	} else if (i >= 3) {
		result = 3;
	} else if (i >= 1) {
		result = 1;
	} else if (i <= -1) {
		result = 2;
	} else {
		result = 0;
	}
	return result;
}